

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

void __thiscall ThreadContext::TryExitExpirableCollectMode(ThreadContext *this)

{
  ExpirableObject *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ExpirableObject **ppEVar4;
  bool bVar5;
  bool bVar6;
  undefined1 local_40 [8];
  Iterator expirableObjectIterator;
  
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,ExpirableCollectPhase);
  if (!bVar2) {
    bVar5 = this->expirableObjectList != (ExpirableObjectList *)0x0;
    bVar2 = 0 < this->numExpirableObjects;
    bVar6 = -1 < this->expirableCollectModeGcCount;
    if ((((((bVar6 && bVar2) && bVar5) && (this->debugManager != (DebugManager *)0x0)) &&
         (this->debugManager->isDebuggerAttaching == false)) &&
        ((((bVar6 && bVar2) && bVar5) && (this->disableExpiration & 1U) == 0 &&
         (this->debugManager != (DebugManager *)0x0)))) &&
       (this->debugManager->isDebuggerAttaching == false)) {
      Output::Trace(ExpirableCollectPhase,
                    L"Checking to see whether to complete Expirable Object Collection: GC Count is %d\n"
                   );
      if (0 < this->expirableCollectModeGcCount) {
        this->expirableCollectModeGcCount = this->expirableCollectModeGcCount + -1;
      }
      if ((this->expirableCollectModeGcCount == 0) &&
         ((this->recycler->inCacheCleanupCollection != false || (DAT_015b5f9b == '\x01')))) {
        Output::Trace(ExpirableCollectPhase,L"Completing Expirable Object Collection\n");
        local_40 = (undefined1  [8])this->expirableObjectList;
        expirableObjectIterator.list = (DListBase<ExpirableObject_*,_RealCount> *)local_40;
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        while( true ) {
          if (expirableObjectIterator.list == (DListBase<ExpirableObject_*,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar3 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                               ,0x66,"(current != nullptr)","current != nullptr");
            if (!bVar2) goto LAB_007bdc90;
            *puVar3 = 0;
          }
          expirableObjectIterator.list =
               ((expirableObjectIterator.list)->super_DListNodeBase<ExpirableObject_*>).next.list;
          if ((undefined1  [8])expirableObjectIterator.list == local_40) break;
          ppEVar4 = DListBase<ExpirableObject_*,_RealCount>::Iterator::Data((Iterator *)local_40);
          this_00 = *ppEVar4;
          if (this_00 == (ExpirableObject *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar3 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                               ,0xb9b,"(object)","object");
            if (!bVar2) {
LAB_007bdc90:
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *puVar3 = 0;
          }
          bVar2 = ExpirableObject::IsObjectUsed(this_00);
          if (!bVar2) {
            (*(this_00->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[6])(this_00);
          }
        }
        this->expirableCollectModeGcCount = -1;
      }
    }
  }
  return;
}

Assistant:

void
ThreadContext::TryExitExpirableCollectMode()
{
    // If this feature is turned off or if we're already in profile collection mode, do nothing
    // We also do nothing if expiration is explicitly disabled by someone lower down the stack
    if (PHASE_OFF1(Js::ExpirableCollectPhase) || !InExpirableCollectMode() || this->disableExpiration)
    {
        return;
    }

    if (InExpirableCollectMode())
    {
        OUTPUT_TRACE(Js::ExpirableCollectPhase, _u("Checking to see whether to complete Expirable Object Collection: GC Count is %d\n"), this->expirableCollectModeGcCount);
        if (this->expirableCollectModeGcCount > 0)
        {
            this->expirableCollectModeGcCount--;
        }

        if (this->expirableCollectModeGcCount == 0 &&
            (this->recycler->InCacheCleanupCollection() || CONFIG_FLAG(ForceExpireOnNonCacheCollect)))
        {
            OUTPUT_TRACE(Js::ExpirableCollectPhase, _u("Completing Expirable Object Collection\n"));

            ExpirableObjectList::Iterator expirableObjectIterator(this->expirableObjectList);

            while (expirableObjectIterator.Next())
            {
                ExpirableObject* object = expirableObjectIterator.Data();

                Assert(object);

                if (!object->IsObjectUsed())
                {
                    object->Expire();
                }
            }

            // Leave expirable collection mode
            expirableCollectModeGcCount = -1;
        }
    }
}